

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cc
# Opt level: O0

void brotli::SplitByteVector<brotli::Histogram<520>,unsigned_short>
               (vector<unsigned_short,_std::allocator<unsigned_short>_> *data,
               size_t literals_per_histogram,size_t max_histograms,size_t sampling_stride_length,
               double block_switch_cost,BlockSplit *split)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  ulong local_90;
  size_t i;
  undefined1 local_80 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> block_ids;
  undefined1 local_58 [8];
  vector<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_> histograms;
  BlockSplit *split_local;
  double block_switch_cost_local;
  size_t sampling_stride_length_local;
  size_t max_histograms_local;
  size_t literals_per_histogram_local;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *data_local;
  
  bVar1 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::empty(data);
  if (bVar1) {
    split->num_types = 1;
  }
  else {
    sVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(data);
    if (sVar2 < 0x80) {
      split->num_types = 1;
      histograms.
      super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (&split->types,
                 (value_type_conflict3 *)
                 ((long)&histograms.
                         super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      sVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(data);
      histograms.
      super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)sVar2;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&split->lengths,
                 (value_type_conflict *)
                 &histograms.
                  super__Vector_base<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      std::vector<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>::vector
                ((vector<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_> *)
                 local_58);
      pvVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[](data,0);
      sVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(data);
      InitialEntropyCodes<brotli::Histogram<520>,unsigned_short>
                (pvVar3,sVar2,literals_per_histogram,max_histograms,sampling_stride_length,
                 (vector<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_> *)
                 local_58);
      pvVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[](data,0);
      sVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(data);
      RefineEntropyCodes<brotli::Histogram<520>,unsigned_short>
                (pvVar3,sVar2,sampling_stride_length,
                 (vector<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_> *)
                 local_58);
      sVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(data);
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&i + 7));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,sVar2,
                 (allocator<unsigned_char> *)((long)&i + 7));
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&i + 7));
      for (local_90 = 0; local_90 < 10; local_90 = local_90 + 1) {
        pvVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[](data,0);
        sVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(data);
        pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,0);
        FindBlocks<unsigned_short,520>
                  (pvVar3,sVar2,block_switch_cost,
                   (vector<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_> *)
                   local_58,pvVar4);
        pvVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[](data,0);
        sVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(data);
        pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,0);
        BuildBlockHistograms<brotli::Histogram<520>,unsigned_short>
                  (pvVar3,sVar2,pvVar4,
                   (vector<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_> *)
                   local_58);
      }
      pvVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[](data,0);
      sVar2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(data);
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,0);
      ClusterBlocks<brotli::Histogram<520>,unsigned_short>(pvVar3,sVar2,pvVar4);
      BuildBlockSplit((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,split);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
      std::vector<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>::~vector
                ((vector<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_> *)
                 local_58);
    }
  }
  return;
}

Assistant:

void SplitByteVector(const std::vector<DataType>& data,
                     const size_t literals_per_histogram,
                     const size_t max_histograms,
                     const size_t sampling_stride_length,
                     const double block_switch_cost,
                     BlockSplit* split) {
  if (data.empty()) {
    split->num_types = 1;
    return;
  } else if (data.size() < kMinLengthForBlockSplitting) {
    split->num_types = 1;
    split->types.push_back(0);
    split->lengths.push_back(static_cast<uint32_t>(data.size()));
    return;
  }
  std::vector<HistogramType> histograms;
  // Find good entropy codes.
  InitialEntropyCodes(&data[0], data.size(),
                      literals_per_histogram,
                      max_histograms,
                      sampling_stride_length,
                      &histograms);
  RefineEntropyCodes(&data[0], data.size(),
                     sampling_stride_length,
                     &histograms);
  // Find a good path through literals with the good entropy codes.
  std::vector<uint8_t> block_ids(data.size());
  for (size_t i = 0; i < 10; ++i) {
    FindBlocks(&data[0], data.size(),
               block_switch_cost,
               histograms,
               &block_ids[0]);
    BuildBlockHistograms(&data[0], data.size(), &block_ids[0], &histograms);
  }
  ClusterBlocks<HistogramType>(&data[0], data.size(), &block_ids[0]);
  BuildBlockSplit(block_ids, split);
}